

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgenericitemmodel.cpp
# Opt level: O2

bool __thiscall
QGenericItemModel::moveRows
          (QGenericItemModel *this,QModelIndex *sourceParent,int sourceRow,int count,
          QModelIndex *destinationParent,int destinationRow)

{
  bool bVar1;
  long in_FS_OFFSET;
  int destinationRow_local;
  int count_local;
  int sourceRow_local;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  destinationRow_local = destinationRow;
  count_local = count;
  sourceRow_local = sourceRow;
  bVar1 = QGenericItemModelImplBase::call<bool,QModelIndex,int,int,QModelIndex,int>
                    (*(QGenericItemModelImplBase **)(this + 0x10),MoveRows,sourceParent,
                     &sourceRow_local,&count_local,destinationParent,&destinationRow_local);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QGenericItemModel::moveRows(const QModelIndex &sourceParent, int sourceRow, int count,
                                 const QModelIndex &destinationParent, int destinationRow)
{
    return impl->call<bool>(QGenericItemModelImplBase::MoveRows,
                            sourceParent, sourceRow, count,
                            destinationParent, destinationRow);
}